

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_sendrecv_(void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *sendtype,MPIABI_Fint *dest,
                     MPIABI_Fint *sendtag,void *recvbuf,MPIABI_Fint *recvcount,MPIABI_Fint *recvtype
                     ,MPIABI_Fint *source,MPIABI_Fint *recvtag,MPIABI_Fint *comm,MPIABI_Fint *status
                     ,MPIABI_Fint *ierror)

{
  mpi_sendrecv_();
  return;
}

Assistant:

void mpiabi_sendrecv_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * sendtype,
  const MPIABI_Fint * dest,
  const MPIABI_Fint * sendtag,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * source,
  const MPIABI_Fint * recvtag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_sendrecv_(
    sendbuf,
    sendcount,
    sendtype,
    dest,
    sendtag,
    recvbuf,
    recvcount,
    recvtype,
    source,
    recvtag,
    comm,
    status,
    ierror
  );
}